

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O3

Options * __thiscall S2BooleanOperation::Options::operator=(Options *this,Options *options)

{
  _Head_base<0UL,_S2Builder::SnapFunction_*,_false> _Var1;
  PolylineModel PVar2;
  _Head_base<0UL,_S2Builder::SnapFunction_*,_false> _Var3;
  _Head_base<0UL,_S2Builder::SnapFunction_*,_false> local_20;
  
  (*((options->snap_function_)._M_t.
     super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>.
     _M_t.
     super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
     .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl)->_vptr_SnapFunction[6])
            (&local_20);
  _Var3._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (SnapFunction *)0x0;
  _Var1._M_head_impl =
       (this->snap_function_)._M_t.
       super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
       ._M_t.
       super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
       .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl;
  (this->snap_function_)._M_t.
  super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>._M_t
  .super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>.
  super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (_Var1._M_head_impl != (SnapFunction *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_SnapFunction[1])();
    if (local_20._M_head_impl != (SnapFunction *)0x0) {
      (*(local_20._M_head_impl)->_vptr_SnapFunction[1])();
    }
  }
  PVar2 = options->polyline_model_;
  this->polygon_model_ = options->polygon_model_;
  this->polyline_model_ = PVar2;
  this->polyline_loops_have_boundaries_ = options->polyline_loops_have_boundaries_;
  this->precision_ = options->precision_;
  this->conservative_output_ = options->conservative_output_;
  this->source_id_lexicon_ = options->source_id_lexicon_;
  return this;
}

Assistant:

S2BooleanOperation::Options& S2BooleanOperation::Options::operator=(
    const Options& options) {
  snap_function_ = options.snap_function_->Clone();
  polygon_model_ = options.polygon_model_;
  polyline_model_ = options.polyline_model_;
  polyline_loops_have_boundaries_ = options.polyline_loops_have_boundaries_;
  precision_ = options.precision_;
  conservative_output_ = options.conservative_output_;
  source_id_lexicon_ = options.source_id_lexicon_;
  return *this;
}